

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreciseDeltaTests.cpp
# Opt level: O2

void __thiscall agge::tests::PreciseDeltaTests::ExtremeMinRatioSupported1(PreciseDeltaTests *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  allocator local_59;
  string local_58;
  LocationInfo local_38;
  
  uVar4 = 0;
  iVar2 = 0;
  for (iVar1 = -0x1000000; iVar1 != 0; iVar1 = iVar1 + 1) {
    uVar3 = uVar4 + 0x2240;
    uVar4 = uVar3 & 0x3fffffff;
    iVar2 = iVar2 + (uVar3 >> 0x1e);
  }
  std::__cxx11::string::string
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PreciseDeltaTests.cpp"
             ,&local_59);
  ut::LocationInfo::LocationInfo(&local_38,&local_58,0xea);
  ut::are_equal(0x89,iVar2,&local_38);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  iVar2 = 0;
  for (iVar1 = -0x1000000; iVar1 != 0; iVar1 = iVar1 + 1) {
    uVar3 = uVar4 - 0x4c0;
    uVar4 = uVar3 & 0x3fffffff;
    iVar2 = iVar2 + ((int)uVar3 >> 0x1e);
  }
  std::__cxx11::string::string
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PreciseDeltaTests.cpp"
             ,&local_59);
  ut::LocationInfo::LocationInfo(&local_38,&local_58,0xf5);
  ut::are_equal(-0x13,iVar2,&local_38);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( ExtremeMinRatioSupported1 )
			{
				// INIT
				precise_delta d(1, 0xFFFFFF);
				int sum = 0;

				// ACT
				d.multiply(137);
				for (int i = 0x1000000; i; --i)
					sum += d.next();

				// ASSERT
				assert_equal(137, sum);

				// INIT
				sum = 0;

				// ACT
				d.multiply(-19);
				for (int i = 0x1000000; i; --i)
					sum += d.next();

				// ASSERT
				assert_equal(-19, sum);
			}